

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

void __thiscall DFireFlicker::Tick(DFireFlicker *this)

{
  int *piVar1;
  sector_t_conflict *psVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  
  piVar1 = &this->m_Count;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  uVar4 = FRandom::operator()(&pr_fireflicker);
  psVar2 = (this->super_DLighting).super_DSectorEffect.m_Sector;
  iVar5 = this->m_MaxLight + (uVar4 & 3) * -0x10;
  if ((int)((int)psVar2->lightlevel + (uVar4 & 3) * -0x10) < this->m_MinLight) {
    iVar5 = this->m_MinLight;
  }
  if (0x7ffe < iVar5) {
    iVar5 = 0x7fff;
  }
  sVar3 = -0x8000;
  if (-0x8000 < iVar5) {
    sVar3 = (short)iVar5;
  }
  psVar2->lightlevel = sVar3;
  this->m_Count = 4;
  return;
}

Assistant:

void DFireFlicker::Tick ()
{
	int amount;

	if (--m_Count == 0)
	{
		amount = (pr_fireflicker() & 3) << 4;

		// [RH] Shouldn't this be (m_MaxLight - amount < m_MinLight)?
		if (m_Sector->lightlevel - amount < m_MinLight)
			m_Sector->SetLightLevel(m_MinLight);
		else
			m_Sector->SetLightLevel(m_MaxLight - amount);

		m_Count = 4;
	}
}